

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *file,
          Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_t sVar4;
  pointer pcVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  undefined8 uVar10;
  size_type *psVar11;
  long lVar12;
  ulong *puVar13;
  string *psVar14;
  char *__end;
  string *psVar15;
  string result;
  string segment;
  string file_no_suffix;
  string local_100;
  string local_e0;
  string *local_c0;
  _anonymous_namespace_ *local_b8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  pcVar3 = *(char **)this;
  local_c0 = __return_storage_ptr__;
  local_b8 = this;
  iVar6 = std::__cxx11::string::find_first_of(pcVar3,0x3f05d2,0);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
  sVar4 = *(size_t *)(pcVar3 + 8);
  if ((sVar4 != kEmptyFile_abi_cxx11_._M_string_length) ||
     ((psVar15 = &kEmptyMetadataFile_abi_cxx11_, sVar4 != 0 &&
      (iVar7 = bcmp(*(void **)pcVar3,kEmptyFile_abi_cxx11_._M_dataplus._M_p,sVar4), iVar7 != 0)))) {
    if (*file != (FileDescriptor)0x1) {
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      std::__cxx11::string::find_last_of(pcVar3,0x43fec6,0xffffffffffffffff);
      sVar4 = *(size_t *)(pcVar3 + 8);
      if ((sVar4 == kEmptyFile_abi_cxx11_._M_string_length) &&
         ((sVar4 == 0 ||
          (iVar7 = bcmp(*(void **)pcVar3,kEmptyFile_abi_cxx11_._M_dataplus._M_p,sVar4), iVar7 == 0))
         )) {
        psVar14 = local_c0;
        (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c0,kEmptyMetadataFile_abi_cxx11_._M_dataplus._M_p,
                   kEmptyMetadataFile_abi_cxx11_._M_dataplus._M_p +
                   kEmptyMetadataFile_abi_cxx11_._M_string_length);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_100,(ulong)pcVar3);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        if ((*(byte *)(*(long *)(local_b8 + 0x78) + 0x29) & 1) == 0) {
          std::__cxx11::string::append((char *)&local_b0);
          if (iVar6 != -1) {
            paVar1 = &local_e0.field_2;
            do {
              std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_50);
              paVar2 = &local_100.field_2;
              anon_unknown_2::UnderscoresToCamelCase(&local_100,&local_e0,true);
              std::__cxx11::string::operator=((string *)&local_90,(string *)&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != paVar2) {
                operator_delete(local_100._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != paVar1) {
                operator_delete(local_e0._M_dataplus._M_p);
              }
              anon_unknown_2::ReservedNamePrefix(&local_70,&local_90,(FileDescriptor *)local_b8);
              plVar8 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
              psVar11 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_e0.field_2._M_allocated_capacity = *psVar11;
                local_e0.field_2._8_8_ = plVar8[3];
                local_e0._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_e0.field_2._M_allocated_capacity = *psVar11;
                local_e0._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_e0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
              psVar11 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_100.field_2._M_allocated_capacity = *psVar11;
                local_100.field_2._8_8_ = plVar8[3];
                local_100._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_100.field_2._M_allocated_capacity = *psVar11;
                local_100._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_100._M_string_length = plVar8[1];
              *plVar8 = (long)psVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_100._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != paVar2) {
                operator_delete(local_100._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != paVar1) {
                operator_delete(local_e0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              iVar6 = std::__cxx11::string::find_first_of
                                ((char *)&local_50,0x3f05d2,(long)(iVar6 + 1));
            } while (iVar6 != -1);
          }
        }
        else {
          puVar13 = (ulong *)(*(ulong *)(*(long *)(local_b8 + 0x78) + 0x88) & 0xfffffffffffffffe);
          if ((puVar13[1] != 0) &&
             (iVar6 = std::__cxx11::string::compare((char *)puVar13), iVar6 != 0)) {
            std::__cxx11::string::_M_append((char *)&local_b0,*puVar13);
            if (local_a8 != 0) {
              lVar12 = 0;
              do {
                if (local_b0[lVar12] == '\\') {
                  local_b0[lVar12] = 0x2f;
                }
                lVar12 = lVar12 + 1;
              } while (local_a8 != lVar12);
            }
            if (local_a8 == 0) {
              uVar10 = std::__throw_out_of_range_fmt
                                 (
                                 "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                 );
              if (local_50 != local_40) {
                operator_delete(local_50);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
              if (local_b0 != local_a0) {
                operator_delete(local_b0);
              }
              _Unwind_Resume(uVar10);
            }
            if (local_b0[local_a8 + -1] != '/') {
              std::__cxx11::string::append((char *)&local_b0);
            }
          }
        }
        std::__cxx11::string::find_last_of((char *)&local_50,0x3f05d2,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_50);
        anon_unknown_2::UnderscoresToCamelCase(&local_100,&local_e0,true);
        paVar1 = &local_100.field_2;
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar1) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        psVar14 = local_c0;
        paVar2 = &local_e0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        anon_unknown_2::ReservedNamePrefix(&local_70,&local_90,(FileDescriptor *)local_b8);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0.field_2._8_8_ = puVar9[3];
          local_e0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_e0._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_90._M_dataplus._M_p)
        ;
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_100.field_2._M_allocated_capacity = *psVar11;
          local_100.field_2._8_8_ = puVar9[3];
          local_100._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_100.field_2._M_allocated_capacity = *psVar11;
          local_100._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_100._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
        (psVar14->_M_dataplus)._M_p = (pointer)&psVar14->field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar11) {
          lVar12 = plVar8[3];
          (psVar14->field_2)._M_allocated_capacity = *psVar11;
          *(long *)((long)&psVar14->field_2 + 8) = lVar12;
        }
        else {
          (psVar14->_M_dataplus)._M_p = (pointer)*plVar8;
          (psVar14->field_2)._M_allocated_capacity = *psVar11;
        }
        psVar14->_M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar1) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      goto LAB_0027c950;
    }
    psVar15 = &kDescriptorMetadataFile_abi_cxx11_;
  }
  psVar14 = local_c0;
  (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
  pcVar5 = (psVar15->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar5,pcVar5 + psVar15->_M_string_length);
LAB_0027c950:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return psVar14;
}

Assistant:

std::string GeneratedMetadataFileName(const FileDescriptor* file,
                                      const Options& options) {
  const std::string& proto_file = file->name();
  int start_index = 0;
  int first_index = proto_file.find_first_of("/", start_index);
  std::string result = "";
  std::string segment = "";

  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  }
  if (options.is_descriptor) {
    return kDescriptorMetadataFile;
  }

  // Append directory name.
  std::string file_no_suffix;
  int lastindex = proto_file.find_last_of(".");
  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  if (file->options().has_php_metadata_namespace()) {
    const std::string& php_metadata_namespace =
        file->options().php_metadata_namespace();
    if (!php_metadata_namespace.empty() && php_metadata_namespace != "\\") {
      result += php_metadata_namespace;
      std::replace(result.begin(), result.end(), '\\', '/');
      if (result.at(result.size() - 1) != '/') {
        result += "/";
      }
    }
  } else {
    result += "GPBMetadata/";
    while (first_index != std::string::npos) {
      segment = UnderscoresToCamelCase(
          file_no_suffix.substr(start_index, first_index - start_index), true);
      result += ReservedNamePrefix(segment, file) + segment + "/";
      start_index = first_index + 1;
      first_index = file_no_suffix.find_first_of("/", start_index);
    }
  }

  // Append file name.
  int file_name_start = file_no_suffix.find_last_of("/");
  if (file_name_start == std::string::npos) {
    file_name_start = 0;
  } else {
    file_name_start += 1;
  }
  segment = UnderscoresToCamelCase(
      file_no_suffix.substr(file_name_start, first_index - file_name_start), true);

  return result + ReservedNamePrefix(segment, file) + segment + ".php";
}